

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__calculate_in_pixel_range
               (int *first_pixel,int *last_pixel,float out_pixel_center,float out_filter_radius,
               float inv_scale,float out_shift,int input_size,stbir_edge edge)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = ((out_pixel_center - out_filter_radius) + out_shift) * inv_scale + 0.5;
  fVar4 = (float)(int)fVar5;
  iVar1 = (int)((float)(-(uint)(fVar5 < fVar4) & 0xbf800000) + fVar4);
  fVar4 = (out_pixel_center + out_filter_radius + out_shift) * inv_scale + -0.5;
  fVar5 = (float)(int)fVar4;
  iVar3 = (int)((float)(-(uint)(fVar4 < fVar5) & 0xbf800000) + fVar5);
  if (iVar3 <= iVar1) {
    iVar3 = iVar1;
  }
  if (edge == STBIR_EDGE_WRAP) {
    iVar2 = -input_size;
    if (iVar1 == iVar2 || SBORROW4(iVar1,iVar2) != iVar1 + input_size < 0) {
      iVar1 = iVar2;
    }
    if (input_size * 2 <= iVar3) {
      iVar3 = input_size * 2 + -1;
    }
  }
  *first_pixel = iVar1;
  *last_pixel = iVar3;
  return;
}

Assistant:

static void stbir__calculate_in_pixel_range( int * first_pixel, int * last_pixel, float out_pixel_center, float out_filter_radius, float inv_scale, float out_shift, int input_size, stbir_edge edge )
{
  int first, last;
  float out_pixel_influence_lowerbound = out_pixel_center - out_filter_radius;
  float out_pixel_influence_upperbound = out_pixel_center + out_filter_radius;

  float in_pixel_influence_lowerbound = (out_pixel_influence_lowerbound + out_shift) * inv_scale;
  float in_pixel_influence_upperbound = (out_pixel_influence_upperbound + out_shift) * inv_scale;

  first = (int)(STBIR_FLOORF(in_pixel_influence_lowerbound + 0.5f));
  last = (int)(STBIR_FLOORF(in_pixel_influence_upperbound - 0.5f));
  if ( last < first ) last = first; // point sample mode can span a value *right* at 0.5, and cause these to cross

  if ( edge == STBIR_EDGE_WRAP )
  {
    if ( first < -input_size )
      first = -input_size;
    if ( last >= (input_size*2))
      last = (input_size*2) - 1;
  }

  *first_pixel = first;
  *last_pixel = last;
}